

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v10::detail::adjust_precision(int *precision,int exp10)

{
  char *message;
  format_error fStack_28;
  
  if ((int)(exp10 ^ 0x7fffffffU) < *precision && 0 < exp10) {
    format_error::runtime_error(&fStack_28,"number is too big");
    message = (char *)std::runtime_error::what();
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/format.h"
                ,0xad9,message);
  }
  *precision = *precision + exp10;
  return;
}

Assistant:

inline FMT_CONSTEXPR20 void adjust_precision(int& precision, int exp10) {
  // Adjust fixed precision by exponent because it is relative to decimal
  // point.
  if (exp10 > 0 && precision > max_value<int>() - exp10)
    FMT_THROW(format_error("number is too big"));
  precision += exp10;
}